

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O2

uint cubicSolver(double *ce,double *roots)

{
  uint uVar1;
  ostream *poVar2;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 local_d8;
  undefined8 local_c8;
  double u3 [2];
  undefined8 local_a8;
  undefined8 local_98;
  double p;
  complex<double> local_68;
  undefined1 local_58 [16];
  double ce2 [2];
  double local_38;
  
  dVar5 = *ce;
  dVar4 = dVar5 * 0.3333333333333333;
  dVar6 = ce[1] - dVar4 * dVar5;
  dVar5 = (dVar5 * 0.07407407407407407 * dVar5 + ce[1] * -0.3333333333333333) * dVar5 + ce[2];
  p = dVar6;
  std::operator<<((ostream *)&std::cout,"cubicSolver:: p=");
  poVar2 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar2,"\tq=");
  poVar2 = std::ostream::_M_insert<double>(dVar5);
  std::endl<char,std::char_traits<char>>(poVar2);
  if (1e-75 <= ABS(dVar6)) {
    dVar7 = dVar6 * 0.037037037037037035 * dVar6 * dVar6 + dVar5 * dVar5 * 0.25;
    std::operator<<((ostream *)&std::cout,"cubicSolver:: discriminant=");
    poVar2 = std::ostream::_M_insert<double>(dVar7);
    std::endl<char,std::char_traits<char>>(poVar2);
    ce2[0] = dVar5;
    if (dVar7 <= 0.0) {
      ce2[1] = 0.0;
      local_68._M_value._8_8_ = 0;
      local_68._M_value._0_8_ = dVar5 * 0.25;
      std::operator*(&local_68,(complex<double> *)ce2);
      local_58._0_8_ =
           (dVar6 * dVar6 * dVar6) / 27.0 + (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_58._8_8_ = dVar7;
      std::sqrt<double>((complex<double> *)local_58);
      dVar7 = -dVar7;
      u3[1] = dVar7;
      u3[0] = dVar5 * -0.5 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      local_38 = 0.3333333333333333;
      std::pow<double>((complex<double> *)u3,&local_38);
      ce2[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
      u3[1]._0_4_ = SUB84(dVar7 * 3.0,0);
      u3[0] = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01) * 3.0;
      u3[1]._4_4_ = (int)((ulong)(dVar7 * 3.0) >> 0x20);
      ce2[1] = dVar7;
      std::operator/(&p,(complex<double> *)u3);
      dVar5 = ce2[0];
      local_c8 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
      u3[1] = 0.8660254037844386;
      u3[0] = -0.5;
      std::operator*((complex<double> *)ce2,(complex<double> *)u3);
      local_a8 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
      local_68._M_value._8_4_ = SUB84(ce2[1] * 3.0,0);
      local_68._M_value._0_8_ = ce2[0] * 3.0;
      local_68._M_value._12_4_ = (int)((ulong)(ce2[1] * 3.0) >> 0x20);
      std::operator*(&local_68,(complex<double> *)u3);
      local_58._4_4_ = extraout_XMM0_Db_04;
      local_58._0_4_ = extraout_XMM0_Da_04;
      local_58._8_8_ = dVar7;
      std::operator/(&p,(complex<double> *)local_58);
      local_98 = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
      std::operator/((complex<double> *)ce2,(complex<double> *)u3);
      local_58._8_4_ = SUB84(p * u3[1],0);
      local_58._0_8_ = p * u3[0];
      local_58._12_4_ = (int)((ulong)(p * u3[1]) >> 0x20);
      local_68._M_value._8_4_ = SUB84(ce2[1] * 3.0,0);
      local_68._M_value._0_8_ = ce2[0] * 3.0;
      local_68._M_value._12_4_ = (int)((ulong)(ce2[1] * 3.0) >> 0x20);
      std::operator/((complex<double> *)local_58,&local_68);
      *roots = (dVar5 - local_c8) - dVar4;
      roots[1] = (local_a8 - local_98) - dVar4;
      roots[2] = ((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06) -
                 (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07)) - dVar4;
      return 3;
    }
    ce2[1] = dVar6 * -0.037037037037037035 * dVar6 * dVar6;
    uVar1 = quadraticSolver(ce2,u3);
    if (uVar1 == 0) {
      std::operator<<((ostream *)&std::cerr,"cubicSolver::Error cubicSolver(");
      poVar2 = std::ostream::_M_insert<double>(*ce);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(ce[1]);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(ce[2]);
      std::operator<<(poVar2,")\n");
    }
    if (dVar5 <= 0.0) {
      dVar5 = pow(u3[0],0.3333333333333333);
      uVar3 = SUB84(dVar5,0);
      uVar1 = (uint)((ulong)dVar5 >> 0x20);
    }
    else {
      dVar5 = pow(-u3[1],0.3333333333333333);
      uVar1 = (uint)((ulong)dVar5 >> 0x20) ^ 0x80000000;
      uVar3 = SUB84(dVar5,0);
    }
    local_d8 = (double)CONCAT44(uVar1,uVar3);
    dVar5 = (dVar6 * -0.3333333333333333) / (double)CONCAT44(uVar1,uVar3);
    std::operator<<((ostream *)&std::cout,"cubicSolver:: u=");
    poVar2 = std::ostream::_M_insert<double>(local_d8);
    std::operator<<(poVar2,"\tv=");
    poVar2 = std::ostream::_M_insert<double>(dVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"cubicSolver:: u^3=");
    poVar2 = std::ostream::_M_insert<double>(local_d8 * local_d8 * local_d8);
    std::operator<<(poVar2,"\tv^3=");
    poVar2 = std::ostream::_M_insert<double>(dVar5 * dVar5 * dVar5);
    std::endl<char,std::char_traits<char>>(poVar2);
    dVar5 = dVar5 + local_d8;
  }
  else if (dVar5 <= 0.0) {
    dVar5 = pow(-dVar5,0.3333333333333333);
  }
  else {
    dVar5 = pow(dVar5,0.3333333333333333);
    dVar5 = -dVar5;
  }
  *roots = dVar5 - dVar4;
  return 1;
}

Assistant:

unsigned int cubicSolver(double * ce, double *roots)
//cubic equation solver
// x^3 + ce[0] x^2 + ce[1] x + ce[2] = 0
{
    // depressed cubic, Tschirnhaus transformation, x= t - b/(3a)
    // t^3 + p t +q =0
    unsigned int ret=0;
    double shift=(1./3)*ce[0];
    double p=ce[1] -shift*ce[0];
    double q=ce[0]*( (2./27)*ce[0]*ce[0]-(1./3)*ce[1])+ce[2];
    //Cardano's method,
    //	t=u+v
    //	u^3 + v^3 + ( 3 uv + p ) (u+v) + q =0
    //	select 3uv + p =0, then,
    //	u^3 + v^3 = -q
    //	u^3 v^3 = - p^3/27
    //	so, u^3 and v^3 are roots of equation,
    //	z^2 + q z - p^3/27 = 0
    //	and u^3,v^3 are,
    //		-q/2 \pm sqrt(q^2/4 + p^3/27)
    //	discriminant= q^2/4 + p^3/27
    std::cout<<"cubicSolver:: p="<<p<<"\tq="<<q<<std::endl;
    double discriminant= (1./27)*p*p*p+(1./4)*q*q;
    if ( fabs(p)< 1.0e-75) {
        ret=1;
        *roots=(q>0)?-pow(q,(1./3)):pow(-q,(1./3));
        *roots -= shift;
        return ret;
    }
    std::cout<<"cubicSolver:: discriminant="<<discriminant<<std::endl;
    if(discriminant>0) {
        double ce2[2]= {q, -1./27*p*p*p},u3[2];
        ret=quadraticSolver(ce2,u3);
        if (! ret ) { //should not happen
            std::cerr<<"cubicSolver::Error cubicSolver("<<ce[0]<<' '<<ce[1]<<' '<<ce[2]<<")\n";
        }
        ret=1;
        double u,v;
        u= (q<=0) ? pow(u3[0], 1./3): -pow(-u3[1],1./3);
        //u=(q<=0)?pow(-0.5*q+sqrt(discriminant),1./3):-pow(0.5*q+sqrt(discriminant),1./3);
        v=(-1./3)*p/u;
        std::cout<<"cubicSolver:: u="<<u<<"\tv="<<v<<std::endl;
        std::cout<<"cubicSolver:: u^3="<<u*u*u<<"\tv^3="<<v*v*v<<std::endl;
        *roots=u+v - shift;
        return ret;
    }
    ret=3;
    std::complex<double> u(q,0),rt[3];
    u=pow(-0.5*u-sqrt(0.25*u*u+p*p*p/27),1./3);
    rt[0]=u-p/(3.*u)-shift;
    std::complex<double> w(-0.5,sqrt(3.)/2);
    rt[1]=u*w-p/(3.*u*w)-shift;
    rt[2]=u/w-p*w/(3.*u)-shift;
//	std::cout<<"Roots:\n";
//	std::cout<<rt[0]<<std::endl;
//	std::cout<<rt[1]<<std::endl;
//	std::cout<<rt[2]<<std::endl;

    roots[0]=rt[0].real();
    roots[1]=rt[1].real();
    roots[2]=rt[2].real();
    return ret;
}